

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Block *block)

{
  pointer *ppLVar1;
  pointer pTVar2;
  pointer pTVar3;
  undefined1 used;
  string_view name;
  string label;
  LabelDecl *local_70 [2];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  used = 1;
  name._M_str = (block->label)._M_dataplus._M_p;
  name._M_len = (block->label)._M_string_length;
  (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
            ((string *)(local_60 + 0x10),(CWriter *)this,name,true);
  DropTypes(this,(ulong)((long)(block->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(block->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  pTVar2 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  PushLabel(this,Block,&block->label,&(block->decl).sig,(bool)used);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (block->decl).sig.param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start,
             (block->decl).sig.param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_70[0] = (LabelDecl *)local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_60._16_8_,local_60._24_8_ + local_60._16_8_);
  Write(this,&block->exprs);
  Write(this,local_70[0]);
  if (local_70[0] != (LabelDecl *)local_60) {
    operator_delete(local_70[0],(ulong)(local_60._0_8_ + 1));
  }
  ResetTypeStack(this,(long)pTVar2 - (long)pTVar3 >> 3);
  ppLVar1 = &(this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppLVar1 = *ppLVar1 + -1;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (block->decl).sig.result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start,
             (block->decl).sig.result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._16_8_ != &local_40) {
    operator_delete((void *)local_60._16_8_,local_40._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CWriter::Write(const Block& block) {
  std::string label = DefineLabelName(block.label);
  DropTypes(block.decl.GetNumParams());
  size_t mark = MarkTypeStack();
  PushLabel(LabelType::Block, block.label, block.decl.sig);
  PushTypes(block.decl.sig.param_types);
  Write(block.exprs, LabelDecl(label));
  ResetTypeStack(mark);
  PopLabel();
  PushTypes(block.decl.sig.result_types);
}